

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_ori_16_tos(void)

{
  uint uVar1;
  uint src;
  
  if (m68ki_cpu.s_flag == 0) {
    m68ki_exception_privilege_violation();
  }
  else {
    uVar1 = m68ki_read_imm_16();
    m68ki_set_sr(m68ki_cpu.t1_flag | m68ki_cpu.t0_flag | m68ki_cpu.s_flag << 0xb |
                 m68ki_cpu.m_flag << 0xb | m68ki_cpu.int_mask |
                 (m68ki_cpu.x_flag & 0x100 | m68ki_cpu.n_flag & 0x80) >> 4 |
                 (uint)((m68ki_cpu.not_z_flag != 0 ^ 0xffU) & 1) << 2 |
                 (m68ki_cpu.v_flag & 0x80) >> 6 | (m68ki_cpu.c_flag & 0x100) >> 8 | uVar1);
  }
  return;
}

Assistant:

static void m68k_op_ori_16_tos(void)
{
	if(FLAG_S)
	{
		uint src = OPER_I_16();
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		m68ki_set_sr(m68ki_get_sr() | src);
		return;
	}
	m68ki_exception_privilege_violation();
}